

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O1

void aom_hadamard_lp_8x8_dual_avx2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i src [8];
  __m256i local_120;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  
  local_120 = *(__m256i *)src_diff;
  local_100 = *(undefined1 (*) [32])(src_diff + src_stride);
  pauVar1 = (undefined1 (*) [32])(*(undefined1 (*) [32])(src_diff + src_stride) + src_stride * 2);
  local_e0 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + src_stride * 2);
  local_c0 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + src_stride * 2);
  local_a0 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + src_stride * 2);
  local_80 = *pauVar1;
  pauVar1 = (undefined1 (*) [32])(*pauVar1 + src_stride * 2);
  local_60 = *pauVar1;
  local_40 = *(undefined1 (*) [32])(*pauVar1 + src_stride * 2);
  hadamard_col8x2_avx2(&local_120,0);
  auVar2 = vpaddw_avx2(local_100,(undefined1  [32])local_120);
  auVar8 = vpsubw_avx2((undefined1  [32])local_120,local_100);
  auVar3 = vpaddw_avx2(local_c0,local_e0);
  auVar9 = vpsubw_avx2(local_e0,local_c0);
  auVar4 = vpaddw_avx2(local_80,local_a0);
  auVar10 = vpsubw_avx2(local_a0,local_80);
  auVar5 = vpaddw_avx2(local_40,local_60);
  auVar11 = vpsubw_avx2(local_60,local_40);
  auVar6 = vpaddw_avx2(auVar2,auVar3);
  auVar7 = vpaddw_avx2(auVar9,auVar8);
  auVar12 = vpsubw_avx2(auVar2,auVar3);
  auVar13 = vpsubw_avx2(auVar8,auVar9);
  auVar2 = vpaddw_avx2(auVar5,auVar4);
  auVar3 = vpaddw_avx2(auVar11,auVar10);
  auVar14 = vpsubw_avx2(auVar4,auVar5);
  auVar10 = vpsubw_avx2(auVar10,auVar11);
  auVar4 = vpaddw_avx2(auVar2,auVar6);
  auVar5 = vpaddw_avx2(auVar3,auVar7);
  auVar8 = vpaddw_avx2(auVar14,auVar12);
  auVar9 = vpaddw_avx2(auVar10,auVar13);
  auVar6 = vpsubw_avx2(auVar6,auVar2);
  auVar3 = vpsubw_avx2(auVar7,auVar3);
  auVar7 = vpsubw_avx2(auVar12,auVar14);
  auVar10 = vpsubw_avx2(auVar13,auVar10);
  auVar2 = vperm2i128_avx2(auVar4,auVar7,0x20);
  *(undefined1 (*) [32])coeff = auVar2;
  auVar2 = vperm2f128_avx(auVar6,auVar8,0x20);
  *(undefined1 (*) [32])(coeff + 0x10) = auVar2;
  auVar2 = vperm2f128_avx(auVar9,auVar10,0x20);
  *(undefined1 (*) [32])(coeff + 0x20) = auVar2;
  auVar2 = vperm2f128_avx(auVar3,auVar5,0x20);
  *(undefined1 (*) [32])(coeff + 0x30) = auVar2;
  auVar2 = vperm2i128_avx2(auVar4,auVar7,0x31);
  *(undefined1 (*) [32])(coeff + 0x40) = auVar2;
  auVar2 = vperm2f128_avx(auVar6,auVar8,0x31);
  *(undefined1 (*) [32])(coeff + 0x50) = auVar2;
  auVar2 = vperm2f128_avx(auVar9,auVar10,0x31);
  *(undefined1 (*) [32])(coeff + 0x60) = auVar2;
  auVar2 = vperm2f128_avx(auVar3,auVar5,0x31);
  *(undefined1 (*) [32])(coeff + 0x70) = auVar2;
  return;
}

Assistant:

void aom_hadamard_lp_8x8_dual_avx2(const int16_t *src_diff,
                                   ptrdiff_t src_stride, int16_t *coeff) {
  __m256i src[8];
  src[0] = _mm256_loadu_si256((const __m256i *)src_diff);
  src[1] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[2] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[3] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[4] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[5] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[6] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[7] = _mm256_loadu_si256((const __m256i *)(src_diff + src_stride));

  hadamard_col8x2_avx2(src, 0);
  hadamard_col8x2_avx2(src, 1);

  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[0], src[1], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[2], src[3], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[4], src[5], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[6], src[7], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[0], src[1], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[2], src[3], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[4], src[5], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[6], src[7], 0x31));
}